

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::SupportVectorClassifier::Clear(SupportVectorClassifier *this)

{
  Kernel *this_00;
  Arena *pAVar1;
  uint32_t cached_has_bits;
  SupportVectorClassifier *this_local;
  
  google::protobuf::RepeatedField<int>::Clear(&this->numberofsupportvectorsperclass_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::Coefficients>::Clear
            (&this->coefficients_);
  google::protobuf::RepeatedField<double>::Clear(&this->rho_);
  google::protobuf::RepeatedField<double>::Clear(&this->proba_);
  google::protobuf::RepeatedField<double>::Clear(&this->probb_);
  pAVar1 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  if (((pAVar1 == (Arena *)0x0) && (this->kernel_ != (Kernel *)0x0)) &&
     (this_00 = this->kernel_, this_00 != (Kernel *)0x0)) {
    Kernel::~Kernel(this_00);
    operator_delete(this_00,0x20);
  }
  this->kernel_ = (Kernel *)0x0;
  clear_supportVectors(this);
  clear_ClassLabels(this);
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void SupportVectorClassifier::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.SupportVectorClassifier)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  numberofsupportvectorsperclass_.Clear();
  coefficients_.Clear();
  rho_.Clear();
  proba_.Clear();
  probb_.Clear();
  if (GetArenaForAllocation() == nullptr && kernel_ != nullptr) {
    delete kernel_;
  }
  kernel_ = nullptr;
  clear_supportVectors();
  clear_ClassLabels();
  _internal_metadata_.Clear<std::string>();
}